

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataStructure.h
# Opt level: O2

void __thiscall TableInfo::TableInfo(TableInfo *this,TableInfo *param_1)

{
  std::__cxx11::string::string((string *)this,(string *)param_1);
  this->attributeNum = param_1->attributeNum;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->attributeName,&param_1->attributeName);
  std::vector<int,_std::allocator<int>_>::vector(&this->type,&param_1->type);
  std::vector<int,_std::allocator<int>_>::vector(&this->constraint,&param_1->constraint);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_Rb_tree(&(this->getID)._M_t,&(param_1->getID)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->indexInfo)._M_t,&(param_1->indexInfo)._M_t);
  this->primary_key_id = param_1->primary_key_id;
  return;
}

Assistant:

TableInfo(){
        tableName = "";
        attributeNum = 0;
        primary_key_id = -1;
    }